

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g12s.c
# Opt level: O2

err_t g12sVerify(g12s_params *params,octet *hash,octet *sig,octet *pubkey)

{
  u32 uVar1;
  qr_o *pqVar2;
  u64 *dest;
  u64 *dest_00;
  err_t eVar3;
  bool_t bVar4;
  int iVar5;
  u64 *dest_01;
  ec_o *ec_00;
  uint uVar6;
  ulong uVar7;
  void *stack;
  ulong n;
  u64 *b;
  ec_o *ec;
  u64 *local_40;
  u64 *local_38;
  ulong count;
  
  ec = (ec_o *)0x0;
  eVar3 = g12sEcCreate(&ec,params,g12sVerify_deep);
  if (eVar3 == 0) {
    uVar1 = params->l;
    uVar6 = uVar1 + 7 >> 3;
    count = (ulong)uVar6;
    bVar4 = memIsValid(hash,count);
    ec_00 = ec;
    if (((bVar4 == 0) || (bVar4 = memIsValid(sig,(ulong)(uVar6 * 2)), ec_00 = ec, bVar4 == 0)) ||
       (bVar4 = memIsValid(pubkey,ec->f->no * 2), bVar4 == 0)) {
      blobClose(ec_00);
      eVar3 = 0x6d;
    }
    else {
      uVar6 = uVar1 + 0x3f >> 6;
      n = (ulong)uVar6;
      b = (u64 *)((long)&(ec_00->hdr).keep + (ec_00->hdr).keep);
      pqVar2 = ec_00->f;
      local_38 = b + pqVar2->n * 2;
      uVar7 = (ulong)(uVar6 * 8);
      local_40 = (u64 *)((long)local_38 + uVar7);
      dest_01 = (u64 *)((long)local_40 + uVar7);
      stack = (void *)(uVar7 + (long)dest_01);
      bVar4 = (*pqVar2->from)(b,pubkey,pqVar2,stack);
      if (bVar4 != 0) {
        pqVar2 = ec_00->f;
        bVar4 = (*pqVar2->from)(b + pqVar2->n,pubkey + pqVar2->no,pqVar2,stack);
        dest = local_40;
        if (bVar4 != 0) {
          memCopy(local_40,sig + count,count);
          memRev(dest,count);
          u64From(dest,dest,count);
          dest_00 = local_38;
          memCopy(local_38,sig,count);
          memRev(dest_00,count);
          u64From(dest_00,dest_00,count);
          bVar4 = wwIsZero(dest,n);
          if (((bVar4 != 0) || (bVar4 = wwIsZero(dest_00,n), bVar4 != 0)) ||
             ((iVar5 = wwCmp(dest,ec_00->order,n), -1 < iVar5 ||
              (iVar5 = wwCmp(dest_00,ec_00->order,n), -1 < iVar5)))) {
            blobClose(ec_00);
            return 0x1fe;
          }
          memCopy(dest_01,hash,count);
          memRev(dest_01,count);
          u64From(dest_01,dest_01,count);
          zzMod(dest_01,dest_01,n,ec_00->order,n,stack);
          bVar4 = wwIsZero(dest_01,n);
          if (bVar4 != 0) {
            *dest_01 = 1;
          }
          zzInvMod(dest_01,dest_01,ec_00->order,n,stack);
          zzMulMod(dest,dest,dest_01,ec_00->order,n,stack);
          zzMulMod(dest_01,dest_01,dest_00,ec_00->order,n,stack);
          zzNegMod(dest_01,dest_01,ec_00->order,n);
          eVar3 = 0;
          bVar4 = ecAddMulA(b,ec_00,stack,2,ec_00->base,dest,n,b,dest_01,n);
          if (bVar4 != 0) {
            (*ec_00->f->to)((octet *)b,b,ec_00->f,stack);
            u64From(b,b,ec_00->f->no);
            zzMod(dest,b,ec_00->f->n,ec_00->order,n,stack);
            bVar4 = wwEq(dest_00,dest,n);
            if (bVar4 == 0) {
              eVar3 = 0x1fe;
            }
            blobClose(ec_00);
            return eVar3;
          }
          blobClose(ec_00);
          return 0x1f6;
        }
      }
      blobClose(ec_00);
      eVar3 = 0x1f9;
    }
  }
  return eVar3;
}

Assistant:

err_t g12sVerify(const g12s_params* params, const octet hash[], 
	const octet sig[], const octet pubkey[])
{
	err_t code;
	size_t m, mo;
	// состояние
	ec_o* ec = 0;
	word* Q;		/* [2n] открытый ключ / точка R */
	word* r;		/* [m] первая (старшая) часть подписи */
	word* s;		/* [m] вторая часть подписи */
	word* e;		/* [m] обработанное хэш-значение, v */
	void* stack;
	// старт
	code = g12sEcCreate(&ec, params, g12sVerify_deep);
	ERR_CALL_CHECK(code);
	// размерности order
	m = W_OF_B(params->l);
	mo = O_OF_B(params->l);
	// проверить входные указатели
	if (!memIsValid(hash, mo) ||
		!memIsValid(sig, 2 * mo) ||
		!memIsValid(pubkey, 2 * ec->f->no))
	{
		g12sEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	Q = objEnd(ec, word);
	r = Q + 2 * ec->f->n;
	s = r + m;
	e = s + m;
	stack = e + m;
	// загрузить Q
	if (!qrFrom(ecX(Q), pubkey, ec->f, stack) ||
		!qrFrom(ecY(Q, ec->f->n), pubkey + ec->f->no, ec->f, stack))
	{
		g12sEcClose(ec);
		return ERR_BAD_PUBKEY;
	}
	// загрузить r и s
	memCopy(s, sig + mo, mo);
	memRev(s, mo);
	wwFrom(s, s, mo);
	memCopy(r, sig, mo);
	memRev(r, mo);
	wwFrom(r, r, mo);
	if (wwIsZero(s, m) || 
		wwIsZero(r, m) || 
		wwCmp(s, ec->order, m) >= 0 ||
		wwCmp(r, ec->order, m) >= 0)
	{
		g12sEcClose(ec);
		return ERR_BAD_SIG;
	}
	// e <- hash \mod q
	memCopy(e, hash, mo);
	memRev(e, mo);
	wwFrom(e, e, mo);
	zzMod(e, e, m, ec->order, m, stack);
	// e == 0 => e <- 1
	if (wwIsZero(e, m))
		e[0] = 1;
	// e <- e^{-1} \mod q [v]
	zzInvMod(e, e, ec->order, m, stack);
	// s <- s e \mod q [z1]
	zzMulMod(s, s, e, ec->order, m, stack);
	// e <- - e r \mod q [z2]
	zzMulMod(e, e, r, ec->order, m, stack);
	zzNegMod(e, e, ec->order, m);
	// Q <- s P + e Q [z1 P + z2 Q = R]
	if (!ecAddMulA(Q, ec, stack, 2, ec->base, s, m, Q, e, m))
	{
		g12sEcClose(ec);
		return ERR_BAD_PARAMS;
	}
	// s <- x_Q \mod q [x_R \mod q]
	qrTo((octet*)Q, ecX(Q), ec->f, stack);
	wwFrom(Q, Q, ec->f->no);
	zzMod(s, Q, ec->f->n, ec->order, m, stack);
	// s == r?
	code = wwEq(r, s, m) ? ERR_OK : ERR_BAD_SIG;
	// завершение
	g12sEcClose(ec);
	return code;
}